

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O2

void flatbuffers::tests::UnicodeTestAllowNonUTF8(void)

{
  bool expval;
  uint8_t *flatbuffer;
  char *pcVar1;
  string jsongen;
  Parser parser;
  
  IDLOptions::IDLOptions((IDLOptions *)&jsongen);
  Parser::Parser(&parser,(IDLOptions *)&jsongen);
  IDLOptions::~IDLOptions((IDLOptions *)&jsongen);
  parser.opts.allow_non_utf8 = true;
  expval = Parser::Parse(&parser,
                         "table T { F:string; }root_type T;{ F:\"\\u20AC\\u00A2\\u30E6\\u30FC\\u30B6\\u30FC\\u5225\\u30B5\\u30A4\\u30C8\\x01\\x80\\u0080\\uD83D\\uDE0E\" }"
                         ,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(expval,true,
                    "\'parser.Parse( \"table T { F:string; }\" \"root_type T;\" \"{ F:\\\"\\\\u20AC\\\\u00A2\\\\u30E6\\\\u30FC\\\\u30B6\\\\u30FC\" \"\\\\u5225\\\\u30B5\\\\u30A4\\\\u30C8\\\\x01\\\\x80\\\\u0080\\\\uD83D\\\\uDE0E\\\" }\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x2f6,"");
  jsongen._M_dataplus._M_p = (pointer)&jsongen.field_2;
  jsongen._M_string_length = 0;
  jsongen.field_2._M_local_buf[0] = '\0';
  parser.opts.indent_step = -1;
  flatbuffer = FlatBufferBuilderImpl<false>::GetBufferPointer(&parser.builder_);
  pcVar1 = GenText(&parser,flatbuffer,&jsongen);
  TestEq<bool,bool>(true,pcVar1 == (char *)0x0,"\'nullptr\' != \'result\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x2fa,"");
  TestEqStr(jsongen._M_dataplus._M_p,
            "{F: \"\\u20AC\\u00A2\\u30E6\\u30FC\\u30B6\\u30FC\\u5225\\u30B5\\u30A4\\u30C8\\u0001\\x80\\u0080\\uD83D\\uDE0E\"}"
            ,
            "\'jsongen.c_str()\' != \'\"{F: \\\"\\\\u20AC\\\\u00A2\\\\u30E6\\\\u30FC\\\\u30B6\\\\u30FC\" \"\\\\u5225\\\\u30B5\\\\u30A4\\\\u30C8\\\\u0001\\\\x80\\\\u0080\\\\uD83D\\\\uDE0E\\\"}\"\'"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
            ,0x2fe,"");
  std::__cxx11::string::~string((string *)&jsongen);
  Parser::~Parser(&parser);
  return;
}

Assistant:

void UnicodeTestAllowNonUTF8() {
  flatbuffers::Parser parser;
  parser.opts.allow_non_utf8 = true;
  TEST_EQ(
      parser.Parse(
          "table T { F:string; }"
          "root_type T;"
          "{ F:\"\\u20AC\\u00A2\\u30E6\\u30FC\\u30B6\\u30FC"
          "\\u5225\\u30B5\\u30A4\\u30C8\\x01\\x80\\u0080\\uD83D\\uDE0E\" }"),
      true);
  std::string jsongen;
  parser.opts.indent_step = -1;
  auto result = GenText(parser, parser.builder_.GetBufferPointer(), &jsongen);
  TEST_NULL(result);
  TEST_EQ_STR(
      jsongen.c_str(),
      "{F: \"\\u20AC\\u00A2\\u30E6\\u30FC\\u30B6\\u30FC"
      "\\u5225\\u30B5\\u30A4\\u30C8\\u0001\\x80\\u0080\\uD83D\\uDE0E\"}");
}